

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Class.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Class::findShadowMembers_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Class *this,Class *_class1)

{
  key_type *__k;
  undefined8 *puVar1;
  bool bVar2;
  const_iterator cVar3;
  long *plVar4;
  const_iterator cVar5;
  string *__rhs;
  long *plVar6;
  size_type *psVar7;
  _Hash_node_base *p_Var8;
  undefined8 *puVar9;
  string shadowMessage;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  value_type local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a8;
  Class *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  Class *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  _Hash_node_base *local_50;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_48;
  key_type *local_40;
  _Hash_node_base *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var8 = (_class1->variables)._M_h._M_before_begin._M_nxt;
  local_a8 = __return_storage_ptr__;
  local_a0 = this;
  local_78 = _class1;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      __k = (key_type *)(p_Var8 + 1);
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->variables)._M_h,__k);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_true>
          ._M_cur != (__node_type *)0x0) {
        cVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->variables)._M_h,__k);
        if (cVar3.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        bVar2 = operator==((Variable *)p_Var8[5]._M_nxt,
                           *(Variable **)
                            ((long)cVar3.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Variable_*>,_true>
                                   ._M_cur + 0x28));
        if (bVar2) {
          std::operator+(&local_70,"Shadow variable ",__k);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
          local_108 = &local_f8;
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_f8 = *plVar6;
            lStack_f0 = plVar4[3];
          }
          else {
            local_f8 = *plVar6;
            local_108 = (long *)*plVar4;
          }
          local_100 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_108,(ulong)(local_78->name)._M_dataplus._M_p);
          local_e8 = &local_d8;
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_d8 = *plVar6;
            lStack_d0 = plVar4[3];
          }
          else {
            local_d8 = *plVar6;
            local_e8 = (long *)*plVar4;
          }
          local_e0 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
          plVar6 = plVar4 + 2;
          if ((long *)*plVar4 == plVar6) {
            local_88 = *plVar6;
            lStack_80 = plVar4[3];
            local_98 = &local_88;
          }
          else {
            local_88 = *plVar6;
            local_98 = (long *)*plVar4;
          }
          local_90 = plVar4[1];
          *plVar4 = (long)plVar6;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_98,(ulong)(local_a0->name)._M_dataplus._M_p);
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_c8.field_2._M_allocated_capacity = *psVar7;
            local_c8.field_2._8_8_ = plVar4[3];
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          }
          else {
            local_c8.field_2._M_allocated_capacity = *psVar7;
            local_c8._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_c8._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88 + 1);
          }
          if (local_e8 != &local_d8) {
            operator_delete(local_e8,local_d8 + 1);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_a8,&local_c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  local_50 = (local_78->functions)._M_h._M_before_begin._M_nxt;
  if (local_50 != (_Hash_node_base *)0x0) {
    local_48 = &(local_a0->functions)._M_h;
    do {
      p_Var8 = local_50[5]._M_nxt;
      local_38 = local_50[6]._M_nxt;
      if (p_Var8 != local_38) {
        local_40 = (key_type *)(local_50 + 1);
        do {
          cVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(local_48,local_40);
          if (cVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
              ._M_cur != (__node_type *)0x0) {
            cVar5 = std::
                    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    ::find(local_48,local_40);
            if (cVar5.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            puVar1 = *(undefined8 **)
                      ((long)cVar5.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
                             ._M_cur + 0x30);
            for (puVar9 = *(undefined8 **)
                           ((long)cVar5.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Function_*,_std::allocator<Function_*>_>_>,_true>
                                  ._M_cur + 0x28); puVar9 != puVar1; puVar9 = puVar9 + 1) {
              bVar2 = operator==((Function *)p_Var8->_M_nxt,(Function *)*puVar9);
              if (bVar2) {
                __rhs = Function::getName_abi_cxx11_((Function *)p_Var8->_M_nxt);
                std::operator+(&local_70,"Shadow function ",__rhs);
                plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
                local_108 = &local_f8;
                plVar6 = plVar4 + 2;
                if ((long *)*plVar4 == plVar6) {
                  local_f8 = *plVar6;
                  lStack_f0 = plVar4[3];
                }
                else {
                  local_f8 = *plVar6;
                  local_108 = (long *)*plVar4;
                }
                local_100 = plVar4[1];
                *plVar4 = (long)plVar6;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_108,
                                            (ulong)(local_78->name)._M_dataplus._M_p);
                local_e8 = &local_d8;
                plVar6 = plVar4 + 2;
                if ((long *)*plVar4 == plVar6) {
                  local_d8 = *plVar6;
                  lStack_d0 = plVar4[3];
                }
                else {
                  local_d8 = *plVar6;
                  local_e8 = (long *)*plVar4;
                }
                local_e0 = plVar4[1];
                *plVar4 = (long)plVar6;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
                plVar6 = plVar4 + 2;
                if ((long *)*plVar4 == plVar6) {
                  local_88 = *plVar6;
                  lStack_80 = plVar4[3];
                  local_98 = &local_88;
                }
                else {
                  local_88 = *plVar6;
                  local_98 = (long *)*plVar4;
                }
                local_90 = plVar4[1];
                *plVar4 = (long)plVar6;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                plVar4 = (long *)std::__cxx11::string::_M_append
                                           ((char *)&local_98,
                                            (ulong)(local_a0->name)._M_dataplus._M_p);
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                psVar7 = (size_type *)(plVar4 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar4 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar7) {
                  local_c8.field_2._M_allocated_capacity = *psVar7;
                  local_c8.field_2._8_8_ = plVar4[3];
                }
                else {
                  local_c8.field_2._M_allocated_capacity = *psVar7;
                  local_c8._M_dataplus._M_p = (pointer)*plVar4;
                }
                local_c8._M_string_length = plVar4[1];
                *plVar4 = (long)psVar7;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                if (local_98 != &local_88) {
                  operator_delete(local_98,local_88 + 1);
                }
                if (local_e8 != &local_d8) {
                  operator_delete(local_e8,local_d8 + 1);
                }
                if (local_108 != &local_f8) {
                  operator_delete(local_108,local_f8 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_70._M_dataplus._M_p != &local_70.field_2) {
                  operator_delete(local_70._M_dataplus._M_p,
                                  local_70.field_2._M_allocated_capacity + 1);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(local_a8,&local_c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p,
                                  local_c8.field_2._M_allocated_capacity + 1);
                }
              }
            }
          }
          p_Var8 = p_Var8 + 1;
        } while (p_Var8 != local_38);
      }
      local_50 = local_50->_M_nxt;
    } while (local_50 != (_Hash_node_base *)0x0);
  }
  return local_a8;
}

Assistant:

std::vector<std::string> Class::findShadowMembers(Class &_class1) {
    std::vector<std::string> shadowMessages;
    for (const auto &v1: _class1.getVariables()) {
        if (getVariables().find(v1.first) != getVariables().end()) {
            auto v2 = getVariables().at(v1.first);
            if (*v1.second == *v2) {
                std::string shadowMessage =
                        "Shadow variable " + v1.first + " between " + _class1.getName() + " and " + getName();
                shadowMessages.push_back(shadowMessage);
            }
        }
    }

    for (const auto &c1: _class1.getFunctions()) {
        for (const auto &f1 : c1.second) {
            if (getFunctions().find(c1.first) != getFunctions().end()) {
                for (const auto &f2 : getFunctions().at(c1.first)) {
                    if (*f1 == *f2) {
                        std::string shadowMessage =
                                "Shadow function " + f1->getName() + " between " + _class1.getName() + " and " +
                                getName();
                        shadowMessages.push_back(shadowMessage);
                    }
                }
            }
        }
    }

    return shadowMessages;
}